

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::ICULCPTranscoder::calcRequiredSize
          (ICULCPTranscoder *this,XMLCh *srcText,MemoryManager *manager)

{
  XMLMutexLock local_38;
  XMLMutexLock lockConverter;
  int32_t targetCap;
  UErrorCode err;
  MemoryManager *manager_local;
  XMLCh *srcText_local;
  ICULCPTranscoder *this_local;
  
  if (srcText == (XMLCh *)0x0) {
    this_local = (ICULCPTranscoder *)0x0;
  }
  else {
    lockConverter.fToLock._4_4_ = 0;
    XMLMutexLock::XMLMutexLock(&local_38,&this->fMutex);
    lockConverter.fToLock._0_4_ =
         ucnv_fromUChars_70(this->fConverter,0,0,srcText,0xffffffff,
                            (undefined1 *)((long)&lockConverter.fToLock + 4));
    XMLMutexLock::~XMLMutexLock(&local_38);
    if (lockConverter.fToLock._4_4_ == 0xf) {
      this_local = (ICULCPTranscoder *)(long)(int)lockConverter.fToLock;
    }
    else {
      this_local = (ICULCPTranscoder *)0x0;
    }
  }
  return (XMLSize_t)this_local;
}

Assistant:

XMLSize_t ICULCPTranscoder::calcRequiredSize(const XMLCh* const srcText
                                                , MemoryManager* const manager)
{
    if (!srcText)
        return 0;

    //
    //  We do two different versions of this, according to whether XMLCh
    //  is the same size as UChar or not.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        // Use a faux scope to synchronize while we do this
        {
            XMLMutexLock lockConverter(&fMutex);

            targetCap = ucnv_fromUChars
            (
                fConverter
                , 0
                , 0
                , (const UChar*)srcText
                , -1
                , &err
            );
        }
    }
    else
    {
        // Copy the source to a local temp
        UChar* tmpBuf = convertToUChar(srcText, 0, manager);
        ArrayJanitor<UChar> janTmp(tmpBuf, manager);

        // Use a faux scope to synchronize while we do this
        {
            XMLMutexLock lockConverter(&fMutex);

            targetCap = ucnv_fromUChars
            (
                fConverter
                , 0
                , 0
                , tmpBuf
                , -1
                , &err
            );
        }
    }

    if (err != U_BUFFER_OVERFLOW_ERROR)
        return 0;

    return (XMLSize_t)targetCap;
}